

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_appender_api.cpp
# Opt level: O0

void TestAppendingSingleDecimalValue<char_const*>
               (char *value,Value *expected_result,uint8_t width,uint8_t scale)

{
  initializer_list<duckdb::Value> iVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  pointer result_00;
  pointer column_number;
  pointer values;
  Value *in_RSI;
  Value *this;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> appender;
  templated_unique_single_t conn;
  templated_unique_single_t db;
  undefined4 in_stack_fffffffffffffcb8;
  Flags in_stack_fffffffffffffcbc;
  undefined6 in_stack_fffffffffffffcc0;
  uchar in_stack_fffffffffffffcc6;
  uchar in_stack_fffffffffffffcc7;
  string *in_stack_fffffffffffffcc8;
  AssertionHandler *in_stack_fffffffffffffcd0;
  DuckDB *in_stack_fffffffffffffcd8;
  size_type in_stack_fffffffffffffce0;
  ExprLhs<bool> *in_stack_fffffffffffffce8;
  Value *pVVar2;
  AssertionHandler *in_stack_fffffffffffffcf0;
  char (*in_stack_fffffffffffffd20) [9];
  Connection *in_stack_fffffffffffffd28;
  Value local_250 [64];
  Value *local_210;
  undefined8 local_208;
  undefined1 local_1e1;
  SourceLineInfo local_1d0;
  StringRef local_1c0;
  allocator local_161;
  string local_160 [32];
  string local_140 [31];
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [23];
  undefined1 local_c9;
  SourceLineInfo local_b8;
  StringRef local_a8;
  undefined8 local_28;
  
  local_28 = 0;
  duckdb::make_uniq<duckdb::DuckDB,decltype(nullptr)>((void **)in_stack_fffffffffffffcd8);
  duckdb::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::make_uniq<duckdb::Connection,duckdb::DuckDB&>(in_stack_fffffffffffffcd8);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::unique_ptr
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)0x5996c5);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             0x5996d2);
  local_a8 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffcc7,
                                         CONCAT16(in_stack_fffffffffffffcc6,
                                                  in_stack_fffffffffffffcc0)),
                        CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
             ,0xf);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
  capturedExpression.m_size = in_stack_fffffffffffffce0;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffcd8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcd0,(StringRef *)in_stack_fffffffffffffcc8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             capturedExpression,in_stack_fffffffffffffcbc);
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"CREATE TABLE decimals(i DECIMAL(%d,%d))",&local_121);
  duckdb::StringUtil::Format<unsigned_char,unsigned_char>
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc6);
  duckdb::Connection::Query(local_e0);
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *
                  )0x599817);
  local_c9 = Catch::Decomposer::operator<=
                       ((Decomposer *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                        false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x599875);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x599882);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator*
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::make_uniq<duckdb::Appender,duckdb::Connection&,char_const(&)[9]>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator=
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             (unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)0x599a3a);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::BaseAppender::BeginRow();
  result_00 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
              operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>
                          *)CONCAT17(in_stack_fffffffffffffcc7,
                                     CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)))
  ;
  duckdb::BaseAppender::Append<char_const*>((char *)result_00);
  column_number =
       duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
                 ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                  CONCAT17(in_stack_fffffffffffffcc7,
                           CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::BaseAppender::EndRow();
  values = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                      CONCAT17(in_stack_fffffffffffffcc7,
                               CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::BaseAppender::Flush();
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"SELECT * FROM decimals",&local_161);
  duckdb::Connection::Query(local_140);
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x599b5c);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x599b69);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_1c0 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffcc7,
                                          CONCAT16(in_stack_fffffffffffffcc6,
                                                   in_stack_fffffffffffffcc0)),
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_appender_api.cpp"
             ,0x19);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
  capturedExpression_00.m_size = in_stack_fffffffffffffce0;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffcd8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcd0,(StringRef *)in_stack_fffffffffffffcc8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             capturedExpression_00,in_stack_fffffffffffffcbc);
  duckdb::Value::Value(local_250,in_RSI);
  local_210 = local_250;
  local_208 = 1;
  std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x599c55);
  iVar1._M_len = (size_type)in_stack_fffffffffffffcd0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffcc8;
  duckdb::vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),iVar1,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  duckdb::CHECK_COLUMN
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             result_00,(size_t)column_number,(vector<duckdb::Value,_true> *)values);
  local_1e1 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x599ce4);
  std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x599cf1);
  pVVar2 = local_250;
  this = (Value *)&local_210;
  do {
    this = this + -0x40;
    duckdb::Value::~Value(this);
  } while (this != pVVar2);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x599eef);
  duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)0x599efc);
  duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             0x599f09);
  duckdb::unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)0x599f16);
  return;
}

Assistant:

void TestAppendingSingleDecimalValue(SRC value, Value expected_result, uint8_t width, uint8_t scale) {
	auto db = make_uniq<DuckDB>(nullptr);
	auto conn = make_uniq<Connection>(*db);
	duckdb::unique_ptr<Appender> appender;
	duckdb::unique_ptr<QueryResult> result;
	REQUIRE_NO_FAIL(conn->Query(StringUtil::Format("CREATE TABLE decimals(i DECIMAL(%d,%d))", width, scale)));
	appender = make_uniq<Appender>(*conn, "decimals");

	appender->BeginRow();
	appender->Append<SRC>(value);
	appender->EndRow();

	appender->Flush();

	result = conn->Query("SELECT * FROM decimals");
	REQUIRE(CHECK_COLUMN(result, 0, {expected_result}));
}